

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

FieldDescriptor * __thiscall
google::protobuf::Descriptor::FindFieldByLowercaseName(Descriptor *this,string_view lowercase_name)

{
  FileDescriptorTables *pFVar1;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
  *this_00;
  FieldDescriptor *pFVar2;
  bool bVar3;
  pointer prVar4;
  const_iterator it;
  anon_union_8_1_a8a14541_for_iterator_2 local_50;
  anon_union_8_1_a8a14541_for_iterator_2 local_48;
  key_arg<std::pair<const_void_*,_std::basic_string_view<char>_>_> local_40;
  
  pFVar1 = this->file_->tables_;
  local_40.first = FileDescriptorTables::FieldsByLowercaseNamesLazyInitStatic;
  local_48 = (anon_union_8_1_a8a14541_for_iterator_2)
             (anon_union_8_1_a8a14541_for_iterator_2)local_50.slot_;
  local_50 = (anon_union_8_1_a8a14541_for_iterator_2)pFVar1;
  if ((pFVar1->fields_by_lowercase_name_once_).control_.super___atomic_base<unsigned_int>._M_i !=
      0xdd) {
    absl::lts_20250127::base_internal::
    CallOnceImpl<void(*)(google::protobuf::FileDescriptorTables_const*),google::protobuf::FileDescriptorTables_const*>
              (&(pFVar1->fields_by_lowercase_name_once_).control_,SCHEDULE_COOPERATIVE_AND_KERNEL,
               (_func_void_FileDescriptorTables_ptr **)&local_40,
               (FileDescriptorTables **)&local_50.slot_);
  }
  this_00 = (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
             *)(pFVar1->fields_by_lowercase_name_)._M_b._M_p;
  local_40.first = this;
  local_40.second._M_len = lowercase_name._M_len;
  local_40.second._M_str = lowercase_name._M_str;
  _local_50 = absl::lts_20250127::container_internal::
              raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>,google::protobuf::FieldDescriptor_const*>,absl::lts_20250127::hash_internal::Hash<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::pair<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>const,google::protobuf::FieldDescriptor_const*>>>
              ::find<std::pair<void_const*,std::basic_string_view<char,std::char_traits<char>>>>
                        (this_00,&local_40);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
              *)this_00);
  local_40.first = (void *)0x0;
  bVar3 = absl::lts_20250127::container_internal::operator==
                    ((iterator *)&local_50,(iterator *)&local_40);
  if (!bVar3) {
    prVar4 = absl::lts_20250127::container_internal::
             raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::pair<const_void_*,_std::basic_string_view<char,_std::char_traits<char>_>_>,_const_google::protobuf::FieldDescriptor_*>_>_>
             ::iterator::operator->((iterator *)&local_50);
    pFVar2 = prVar4->second;
    if (pFVar2 != (FieldDescriptor *)0x0) {
      if ((pFVar2->field_0x1 & 8) != 0) {
        return (FieldDescriptor *)0x0;
      }
      return pFVar2;
    }
  }
  return (FieldDescriptor *)0x0;
}

Assistant:

const FieldDescriptor* Descriptor::FindFieldByLowercaseName(
    absl::string_view lowercase_name) const {
  const FieldDescriptor* result =
      file()->tables_->FindFieldByLowercaseName(this, lowercase_name);
  if (result == nullptr || result->is_extension()) {
    return nullptr;
  } else {
    return result;
  }
}